

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O2

void pltcalc::getperiodweights(void)

{
  FILE *__stream;
  size_t sVar1;
  mapped_type *pmVar2;
  double dVar3;
  Periods p;
  
  __stream = fopen("input/periods.bin","rb");
  if (__stream == (FILE *)0x0) {
    p.period_no = 1;
    while( true ) {
      if (no_of_periods_ < p.period_no) break;
      dVar3 = (double)no_of_periods_;
      pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)period_weights_,&p.period_no);
      *pmVar2 = 1.0 / dVar3;
      p.period_no = p.period_no + 1;
    }
  }
  else {
    while( true ) {
      sVar1 = fread(&p,0xc,1,__stream);
      dVar3 = p.weighting;
      if (sVar1 == 0) break;
      pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)period_weights_,&p.period_no);
      *pmVar2 = dVar3;
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void getperiodweights()
	{

		FILE *fin = fopen(PERIODS_FILE, "rb");

		// If there is no periods file, period weights are reciprocal
		// of number of periods
		if (fin == nullptr) {
			for (int i = 1; i <= no_of_periods_; i++) {
				period_weights_[i] = 1 / (double)no_of_periods_;
			}
			return;
		}

		Periods p;
		while (fread(&p, sizeof(Periods), 1, fin) != 0){
			period_weights_[p.period_no] = p.weighting;
		}

		fclose(fin);

	}